

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_m33d(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  long in_RSI;
  exr_attr_m33d_t tmp;
  exr_result_t rv;
  void *in_stack_ffffffffffffff98;
  _internal_exr_context *in_stack_ffffffffffffffa0;
  _internal_exr_context *in_stack_ffffffffffffffa8;
  exr_result_t local_14;
  
  memcpy(&stack0xffffffffffffffa4,*(void **)(in_RSI + 0x18),0x48);
  local_14 = save_attr_sz(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  if (local_14 == 0) {
    local_14 = save_attr_64(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_m33d (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t    rv;
    exr_attr_m33d_t tmp = *(a->m33d);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_m33d_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_64 (ctxt, &tmp, 9);
    return rv;
}